

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O0

void cvode_kinetic(Item *qsol,Symbol *fun,int numeqn,int listnum)

{
  anon_union_8_4_46e41722_for_element *paVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  Symbol *in_RSI;
  Item *qnext;
  Item *pend;
  Item *pbeg;
  Item *q;
  int out;
  Item *qn;
  char *in_stack_ffffffffffffffa8;
  undefined3 uVar5;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  Item *in_stack_ffffffffffffffb8;
  Item *pIVar6;
  Item *in_stack_ffffffffffffffc0;
  Item *pIVar7;
  char *in_stack_ffffffffffffffc8;
  Symbol *in_stack_ffffffffffffffd0;
  Item *pIVar8;
  Symbol *in_stack_ffffffffffffffe0;
  
  if (done_list != (List *)0x0) {
    in_stack_ffffffffffffffd0 = (Symbol *)done_list->next;
    while (in_stack_ffffffffffffffd0 != (Symbol *)done_list) {
      in_stack_ffffffffffffffe0 = *(Symbol **)&in_stack_ffffffffffffffd0->nrntype;
      paVar1 = (anon_union_8_4_46e41722_for_element *)&in_stack_ffffffffffffffd0->subtype;
      in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffe0;
      if ((Symbol *)paVar1->itm == in_RSI) {
        delete((Item *)0x114358);
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffd0;
      }
    }
  }
  kinetic_intmethod(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  lappendstr((List *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  sprintf(buf,"static int _ode_spec%d() {_reset=0;{\n",(ulong)(uint)(in_RSI->u).i);
  lappendstr((List *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  sprintf(buf,"static int _ode_spec%d(_threadargsproto_) {int _reset=0;{\n",
          (ulong)(uint)(in_RSI->u).i);
  vectorize_substitute
            ((Item *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  copyitems(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
            (Item *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  lappendstr((List *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  sprintf(buf,"static int _ode_matsol%d() {_reset=0;{\n",(ulong)(uint)(in_RSI->u).i);
  lappendstr((List *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  sprintf(buf,
          "static int _ode_matsol%d(void* _so, double* _rhs, _threadargsproto_) {int _reset=0;{\n",
          (ulong)(uint)(in_RSI->u).i);
  vectorize_substitute
            ((Item *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  cvode_flag = 1;
  kinetic_implicit(in_RSI,(char *)CONCAT44(in_EDX,in_ECX),(char *)in_stack_ffffffffffffffe0);
  cvode_flag = 0;
  pIVar6 = procfunc->prev;
  copyitems(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
            (Item *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  pIVar7 = procfunc->prev;
  while (pIVar8 = pIVar6, pIVar8 != pIVar7) {
    pIVar6 = pIVar8->next;
    if ((pIVar8->itemtype == 1) &&
       ((iVar3 = strcmp(((pIVar8->element).sym)->name,"f_flux"), iVar3 == 0 ||
        (iVar3 = strcmp(((pIVar8->element).sym)->name,"b_flux"), iVar3 == 0)))) {
      bVar2 = false;
      while( true ) {
        in_stack_ffffffffffffffb4 = (int)pIVar8->itemtype;
        if (in_stack_ffffffffffffffb4 == 1) {
          if (*((pIVar8->element).sym)->name == ';') {
            bVar2 = true;
          }
        }
        else if ((in_stack_ffffffffffffffb4 == 0x143) &&
                (pcVar4 = strchr((pIVar8->element).str,0x3b), pcVar4 != (char *)0x0)) {
          bVar2 = true;
        }
        if (bVar2) break;
        pIVar8 = pIVar8->prev;
      }
      pIVar6 = pIVar8->next;
      while( true ) {
        uVar5 = (undefined3)in_stack_ffffffffffffffb0;
        in_stack_ffffffffffffffb0 = CONCAT13(1,uVar5);
        if (pIVar6->itemtype == 1) {
          in_stack_ffffffffffffffb0 = CONCAT13(*((pIVar6->element).sym)->name != ';',uVar5);
        }
        if ((char)((uint)in_stack_ffffffffffffffb0 >> 0x18) == '\0') break;
        pIVar6 = pIVar6->next;
        delete((Item *)0x114678);
      }
      pIVar6 = pIVar6->next;
      delete((Item *)0x11469e);
    }
  }
  lappendstr((List *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void cvode_kinetic(qsol, fun, numeqn, listnum)
	Item* qsol;
	Symbol* fun;
	int numeqn, listnum;
{
#if 1
	Item* qn;
	int out;
	Item* q, *pbeg, *pend, *qnext;
	/* get a list of the original items so we can keep removing
	   the added ones to get back to the original list.
	*/
	if (done_list) for (q = done_list->next; q != done_list; q = qn) {
		qn = q->next;
		if (SYM(q) == fun) {
			delete(q);
		}
	}
	kinetic_intmethod(fun, "NEURON's CVode");
	Lappendstr(procfunc, "\n/*CVODE ode begin*/\n");
	sprintf(buf, "static int _ode_spec%d() {_reset=0;{\n", fun->u.i);
	Lappendstr(procfunc, buf);
	sprintf(buf, "static int _ode_spec%d(_threadargsproto_) {int _reset=0;{\n", fun->u.i);
	vectorize_substitute(procfunc->prev, buf);
	copyitems(cvode_sbegin, cvode_send, procfunc->prev);

	Lappendstr(procfunc, "\n/*CVODE matsol*/\n");
	sprintf(buf, "static int _ode_matsol%d() {_reset=0;{\n", fun->u.i);
	Lappendstr(procfunc, buf);
	sprintf(buf, "static int _ode_matsol%d(void* _so, double* _rhs, _threadargsproto_) {int _reset=0;{\n", fun->u.i);
	vectorize_substitute(procfunc->prev, buf);
	cvode_flag = 1;
	kinetic_implicit(fun, "dt", "ZZZ");
	cvode_flag = 0;
	pbeg = procfunc->prev;
	copyitems(cvode_sbegin, cvode_send, procfunc->prev);
	pend = procfunc->prev;
#if 1
	/* remove statements containing f_flux or b_flux */
	for (q = pbeg; q != pend; q = qnext) {
		qnext = q->next;
		if (q->itemtype == SYMBOL && 
		  (strcmp(SYM(q)->name, "f_flux") == 0 || 
		   strcmp(SYM(q)->name, "b_flux") == 0 )) {
		  
			/* find the beginning of the statement */
			out = 0;
			for (;;) {
				switch(q->itemtype) {
				case STRING:
					if (strchr(STR(q), ';')) {
						out = 1;
					}
					break;
				case SYMBOL:
					if (SYM(q)->name[0] == ';') {
						out = 1;
					}
					break;
				}
				if (out) {
					break;
				}
				q = q->prev;
			}
			q = q->next;
			/* delete the statement */
			while (q->itemtype != SYMBOL || SYM(q)->name[0] != ';') {
				qnext = q->next;
				delete(q);
				q = qnext;
			}
			qnext = q->next;
			delete(q);
		}
	}
#endif
	Lappendstr(procfunc, "\n/*CVODE end*/\n");

#endif
}